

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine.cpp
# Opt level: O0

QImage * __thiscall QFontEngine::renderedPathForGlyph(QFontEngine *this,glyph_t glyph,QColor *color)

{
  QColor color_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 *in_RCX;
  uint in_EDX;
  QImage *in_RSI;
  QImage *in_RDI;
  long in_FS_OFFSET;
  int glyph_height;
  int glyph_width;
  int glyph_y;
  int glyph_x;
  QImage *im;
  QPainter p;
  QPainterPath path;
  QFixedPoint pt;
  glyph_metrics_t gm;
  QImage *this_00;
  uint7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  undefined1 uVar5;
  byte bVar6;
  undefined4 in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  undefined1 *puVar7;
  undefined1 *local_60;
  QFixed local_54;
  QFixed local_50;
  undefined8 local_4c;
  undefined4 local_44;
  QFixed local_40;
  undefined4 local_3c;
  QFixed local_38;
  undefined8 local_34;
  undefined8 local_2c;
  undefined1 *local_24;
  undefined1 local_1c [4];
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_34 = &DAT_aaaaaaaaaaaaaaaa;
  local_2c = &DAT_aaaaaaaaaaaaaaaa;
  local_24 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  (*(in_RSI->super_QPaintDevice)._vptr_QPaintDevice[0x1c])(&local_34,in_RSI,(ulong)in_EDX);
  QFixed::toReal((QFixed *)&local_34);
  iVar1 = qFloor<double>(3.82138779268256e-317);
  QFixed::toReal((QFixed *)((long)&local_34 + 4));
  iVar2 = qFloor<double>(3.82140063838935e-317);
  local_3c = (undefined4)local_2c;
  local_38 = QFixed::operator+((QFixed *)in_RDI,(int)this_00);
  QFixed::toReal(&local_38);
  iVar3 = qCeil<double>(3.82142880013116e-317);
  local_44 = local_2c._4_4_;
  local_40 = QFixed::operator+((QFixed *)in_RDI,(int)this_00);
  QFixed::toReal(&local_40);
  iVar4 = qCeil<double>(3.82145795000427e-317);
  if ((iVar3 - iVar1 < 1) || (iVar4 - iVar2 < 1)) {
    QImage::QImage(this_00);
  }
  else {
    local_4c = &DAT_aaaaaaaaaaaaaaaa;
    QFixedPoint::QFixedPoint((QFixedPoint *)this_00);
    QFixed::QFixed(&local_50,-iVar1);
    local_4c = (undefined1 *)CONCAT44(local_4c._4_4_,local_50.val);
    QFixed::QFixed(&local_54,-iVar2);
    local_4c = (undefined1 *)CONCAT44(local_54.val,(undefined4)local_4c);
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    QPainterPath::QPainterPath((QPainterPath *)0x76063d);
    QPainterPath::setFillRule
              ((QPainterPath *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
               (FillRule)((ulong)in_RSI >> 0x20));
    uVar5 = 0;
    (((__uniq_ptr_data<QPainterPrivate,_std::default_delete<QPainterPrivate>,_true,_true> *)
     &(in_RDI->super_QPaintDevice)._vptr_QPaintDevice)->
    super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>)._M_t.
    super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
    super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl =
         (QPainterPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&(in_RDI->super_QPaintDevice).painters = &DAT_aaaaaaaaaaaaaaaa;
    in_RDI->d = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
    QImage::QImage((QImage *)(ulong)in_stack_ffffffffffffff60,(int)((ulong)in_RSI >> 0x20),
                   (int)in_RSI,(Format)((ulong)this_00 >> 0x20));
    QImage::fill(in_RSI,(GlobalColor)((ulong)this_00 >> 0x20));
    puVar7 = &DAT_aaaaaaaaaaaaaaaa;
    QPainter::QPainter((QPainter *)CONCAT17(uVar5,in_stack_ffffffffffffff60),
                       &in_RSI->super_QPaintDevice);
    QPainter::setRenderHint
              ((QPainter *)this_00,(RenderHint)((ulong)in_RDI >> 0x20),
               SUB81((ulong)in_RDI >> 0x18,0));
    memset(&stack0xffffffffffffff94,0,4);
    QFlags<QTextItem::RenderFlag>::QFlags((QFlags<QTextItem::RenderFlag> *)0x7606db);
    (*(in_RSI->super_QPaintDevice)._vptr_QPaintDevice[0xf])
              (in_RSI,local_1c,&local_4c,1,&local_60,(ulong)in_stack_ffffffffffffff94);
    QPainter::setPen((QPainter *)this_00,(PenStyle)((ulong)in_RCX >> 0x20));
    local_18 = *in_RCX;
    local_10 = in_RCX[1];
    color_00.ct._0_4_ = in_stack_ffffffffffffff94;
    color_00.cspec = in_stack_ffffffffffffff90;
    color_00._8_8_ = puVar7;
    QPainter::setBrush((QPainter *)in_RDI,color_00);
    QPainter::drawPath((QPainter *)CONCAT17(uVar5,in_stack_ffffffffffffff60),(QPainterPath *)in_RSI)
    ;
    QPainter::end((QPainter *)CONCAT17(uVar5,in_stack_ffffffffffffff60));
    bVar6 = 1;
    QPainter::~QPainter((QPainter *)this_00);
    if ((bVar6 & 1) == 0) {
      QImage::~QImage(this_00);
    }
    QPainterPath::~QPainterPath((QPainterPath *)0x760786);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QImage QFontEngine::renderedPathForGlyph(glyph_t glyph, const QColor &color)
{
    glyph_metrics_t gm = boundingBox(glyph);
    int glyph_x = qFloor(gm.x.toReal());
    int glyph_y = qFloor(gm.y.toReal());
    int glyph_width = qCeil((gm.x + gm.width).toReal()) -  glyph_x;
    int glyph_height = qCeil((gm.y + gm.height).toReal()) - glyph_y;

    if (glyph_width <= 0 || glyph_height <= 0)
        return QImage();
    QFixedPoint pt;
    pt.x = -glyph_x;
    pt.y = -glyph_y; // the baseline
    QPainterPath path;
    path.setFillRule(Qt::WindingFill);
    QImage im(glyph_width, glyph_height, QImage::Format_ARGB32_Premultiplied);
    im.fill(Qt::transparent);
    QPainter p(&im);
    p.setRenderHint(QPainter::Antialiasing);
    addGlyphsToPath(&glyph, &pt, 1, &path, { });
    p.setPen(Qt::NoPen);
    p.setBrush(color);
    p.drawPath(path);
    p.end();

    return im;
}